

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O3

qm_val_t *
av1_get_iqmatrix(CommonQuantParams *quant_params,MACROBLOCKD *xd,int plane,TX_SIZE tx_size,
                TX_TYPE tx_type)

{
  qm_val_t *(*paapqVar1) [3] [19];
  int iVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  
  iVar2 = (int)CONCAT71(in_register_00000009,tx_size);
  if (iVar2 < 0x11) {
    uVar3 = 3;
    if ((iVar2 - 0xbU < 2) || (iVar2 == 4)) goto LAB_003a0037;
  }
  else {
    if (iVar2 == 0x11) {
      uVar3 = 9;
      goto LAB_003a0037;
    }
    if (iVar2 == 0x12) {
      uVar3 = 10;
      goto LAB_003a0037;
    }
  }
  uVar3 = (ulong)tx_size;
LAB_003a0037:
  paapqVar1 = (qm_val_t *(*) [3] [19])
              (xd->plane[plane].seg_iqmatrix + (*(ushort *)&(*xd->mi)->field_0xa7 & 7));
  if (8 < tx_type) {
    paapqVar1 = quant_params->giqmatrix + 0xf;
  }
  return (*paapqVar1)[0][uVar3];
}

Assistant:

const qm_val_t *av1_get_iqmatrix(const CommonQuantParams *quant_params,
                                 const MACROBLOCKD *xd, int plane,
                                 TX_SIZE tx_size, TX_TYPE tx_type) {
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int seg_id = mbmi->segment_id;
  const TX_SIZE qm_tx_size = av1_get_adjusted_tx_size(tx_size);
  // Use a flat matrix (i.e. no weighting) for 1D and Identity transforms
  return is_2d_transform(tx_type)
             ? pd->seg_iqmatrix[seg_id][qm_tx_size]
             : quant_params->giqmatrix[NUM_QM_LEVELS - 1][0][qm_tx_size];
}